

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::setMetaContent(MidiMessage *this,string *content)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference puVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  back_insert_iterator<smf::MidiMessage> __result;
  uchar local_51;
  iterator iStack_50;
  uchar item;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vlv;
  int dsize;
  string *content_local;
  MidiMessage *this_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  if ((1 < sVar2) &&
     (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0),
     *pvVar3 == 0xff)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
    vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = std::__cxx11::string::size();
    intToVlv((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,
             vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
    __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
    iStack_50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0), bVar1) {
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end1);
      local_51 = *puVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_51);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end1);
    }
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result = std::back_inserter<smf::MidiMessage>(this);
    std::
    copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<smf::MidiMessage>>
              (__first,__last,__result);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  }
  return;
}

Assistant:

void MidiMessage::setMetaContent(const std::string& content) {
	if (this->size() < 2) {
		// invalid message, so ignore request
		return;
	}
	if (operator[](0) != 0xFF) {
		// not a meta message, so ignore request
		return;
	}
	this->resize(2);

	// add the size of the meta message data (VLV)
	int dsize = (int)content.size();
	std::vector<uchar> vlv = intToVlv(dsize);
	for (uchar item : vlv) {
		this->push_back(item);
	}
	std::copy(content.begin(), content.end(), std::back_inserter(*this));
}